

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_array_primitive_hash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t nextHash;
  undefined8 local_48;
  size_t i;
  size_t result;
  size_t size;
  sysbvm_array_t **array;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar1 = sysbvm_array_getSize(*arguments);
  sVar2 = sysbvm_tuple_getType(context,*arguments);
  i = sysbvm_tuple_identityHash(sVar2);
  for (local_48 = 0; local_48 < sVar1; local_48 = local_48 + 1) {
    nextHash = sysbvm_tuple_hash(context,*(sysbvm_tuple_t *)(*arguments + 0x10 + local_48 * 8));
    i = sysbvm_hashConcatenate(i,nextHash);
  }
  sVar2 = sysbvm_tuple_size_encode(context,i);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_array_primitive_hash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_array_t **array = (sysbvm_array_t **)&arguments[0];
    size_t size = sysbvm_array_getSize((sysbvm_tuple_t)*array);

    size_t result = sysbvm_tuple_identityHash(sysbvm_tuple_getType(context, (sysbvm_tuple_t)*array));
    for(size_t i = 0; i < size; ++i)
        result = sysbvm_hashConcatenate(result, sysbvm_tuple_hash(context, (*array)->elements[i]));

    return sysbvm_tuple_size_encode(context, result);
}